

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerivedModule.h
# Opt level: O1

any __thiscall
Scine::Core::DerivedModule::detail::ResolveModel::operator()
          (ResolveModel *this,
          pair<Scine::Core::DummyInterface,_boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>
          *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CreateInterfacePointer<Scine::Core::DummyInterface> local_61;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  ModelTypeIdentifierMatches local_40;
  
  local_60 = &local_50;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,*(long *)param_1,*(long *)(param_1 + 8) + *(long *)param_1);
  paVar1 = &local_40.identifier.field_2;
  if (local_60 == &local_50) {
    local_40.identifier.field_2._8_8_ = local_50._8_8_;
    local_40.identifier._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_40.identifier._M_dataplus._M_p = (pointer)local_60;
  }
  local_40.identifier.field_2._M_allocated_capacity._1_7_ = local_50._M_allocated_capacity._1_7_;
  local_40.identifier.field_2._M_local_buf[0] = local_50._M_local_buf[0];
  local_40.identifier._M_string_length = local_58;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_60 = &local_50;
  exec_if_impl<false>::
  execute<boost::mpl::v_iter<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,0l>,boost::mpl::v_iter<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,2l>,Scine::Core::DerivedModule::detail::ModelTypeIdentifierMatches,Scine::Core::DerivedModule::detail::CreateInterfacePointer<Scine::Core::DummyInterface>>
            ((exec_if_impl<false> *)this,
             (v_iter<boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_0L>
              *)0x0,(v_iter<boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_2L>
                     *)0x0,&local_40,&local_61);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.identifier._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.identifier._M_dataplus._M_p,
                    local_40.identifier.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0])
                             + 1);
  }
  return (any)(placeholder *)this;
}

Assistant:

boost::any operator()(PairType* /* model */ = 0) const {
    using InterfaceType = typename boost::mpl::first<PairType>::type;
    using ModelTypeList = typename boost::mpl::second<PairType>::type;

    return detail::exec_if<ModelTypeList>(detail::ModelTypeIdentifierMatches{identifier},
                                          CreateInterfacePointer<InterfaceType>{});
  }